

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_comm_struct.hpp
# Opt level: O3

void form_global_comm(comm_data *param_1,comm_data *global_data,
                     vector<int,_std::allocator<int>_> *param_3,MPI_Comm mpi_comm,
                     topo_data *topo_info,int tag)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  size_type sVar14;
  vector<int,_std::allocator<int>_> node_sizes;
  int local_num_procs;
  int local_rank;
  int num_procs;
  int rank;
  vector<int,_std::allocator<int>_> node_ctr;
  value_type_conflict local_7c;
  vector<int,_std::allocator<int>_> local_78;
  pointer local_60;
  undefined1 local_58 [4];
  undefined1 local_54 [4];
  undefined1 local_50 [4];
  undefined1 local_4c [4];
  vector<int,_std::allocator<int>_> local_48;
  
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  MPI_Comm_rank(&ompi_mpi_comm_world,local_4c);
  MPI_Comm_size(&ompi_mpi_comm_world,local_50);
  MPI_Comm_rank(*(undefined8 *)(mpi_comm + 0x10),local_54);
  MPI_Comm_size(*(undefined8 *)(mpi_comm + 0x10),local_58);
  iVar11 = *(int *)(mpi_comm + 8);
  local_7c = 0;
  std::vector<int,_std::allocator<int>_>::resize(&local_78,(long)iVar11,&local_7c);
  if (0 < param_1->num_msgs) {
    piVar4 = (param_3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = param_1->indptr;
    lVar9 = 0;
    do {
      iVar1 = piVar4[lVar9];
      iVar2 = piVar7[lVar9 + 1];
      iVar3 = piVar7[lVar9];
      iVar12 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar1];
      if (iVar12 == 0) {
        global_data->num_msgs = global_data->num_msgs + 1;
        iVar12 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar1];
      }
      lVar9 = lVar9 + 1;
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar1] = (iVar2 - iVar3) + iVar12;
    } while (lVar9 < param_1->num_msgs);
  }
  iVar1 = global_data->num_msgs;
  sVar14 = (size_type)iVar1;
  if (sVar14 != 0) {
    uVar10 = 0xffffffffffffffff;
    if (-1 < iVar1) {
      uVar10 = sVar14 * 4;
    }
    piVar7 = (int *)operator_new__(uVar10);
    global_data->procs = piVar7;
  }
  uVar10 = 0xffffffffffffffff;
  if (-2 < iVar1) {
    uVar10 = sVar14 * 4 + 4;
  }
  piVar7 = (int *)operator_new__(uVar10);
  global_data->indptr = piVar7;
  local_7c = 0;
  std::vector<int,_std::allocator<int>_>::resize(&local_48,sVar14,&local_7c);
  global_data->num_msgs = 0;
  piVar7 = global_data->indptr;
  *piVar7 = 0;
  if (0 < iVar11) {
    sVar14 = 0;
    do {
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[sVar14] != 0) {
        global_data->procs[global_data->num_msgs] = (int)sVar14;
        global_data->size_msgs =
             global_data->size_msgs +
             local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[sVar14];
        iVar1 = global_data->num_msgs;
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[sVar14] = iVar1;
        global_data->num_msgs = iVar1 + 1;
        piVar7[(long)iVar1 + 1] = global_data->size_msgs;
      }
      sVar14 = sVar14 + 1;
    } while ((long)iVar11 != sVar14);
  }
  iVar11 = global_data->size_msgs;
  if ((long)iVar11 != 0) {
    uVar10 = 0xffffffffffffffff;
    if (-1 < iVar11) {
      uVar10 = (long)iVar11 << 2;
    }
    piVar8 = (int *)operator_new__(uVar10);
    global_data->indices = piVar8;
  }
  iVar11 = param_1->num_msgs;
  if (0 < iVar11) {
    local_60 = (param_3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    piVar8 = param_1->indptr;
    lVar9 = 0;
    do {
      iVar1 = piVar8[lVar9];
      lVar13 = (long)iVar1;
      iVar2 = piVar8[lVar9 + 1];
      if (iVar1 < iVar2) {
        iVar11 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[local_60[lVar9]];
        piVar5 = param_1->indices;
        piVar6 = global_data->indices;
        do {
          iVar1 = piVar7[iVar11];
          iVar3 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar11];
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar11] = iVar3 + 1;
          piVar6[(long)iVar1 + (long)iVar3] = piVar5[lVar13];
          lVar13 = lVar13 + 1;
        } while (iVar2 != lVar13);
        iVar11 = param_1->num_msgs;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar11);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void form_global_comm(comm_data* local_data, comm_data* global_data,
        std::vector<int>& local_data_nodes, MPI_Comm mpi_comm,
        topo_data* topo_info, int tag)
{
    std::vector<int> tmp_send_indices;
    std::vector<int> node_sizes;
    std::vector<int> node_ctr;

    // Get MPI Information
    int rank, num_procs;
    int local_rank, local_num_procs;
    MPI_Comm_rank(mpi_comm, &rank);
    MPI_Comm_size(mpi_comm, &num_procs);
    MPI_Comm& local_comm = topo_info->local_comm;
    MPI_Comm_rank(local_comm, &local_rank);
    MPI_Comm_size(local_comm, &local_num_procs);
    int num_nodes = topo_info->num_nodes;
    int rank_node = topo_info->rank_node;

    int node_idx;
    int start, end, idx;
    int ctr, node, size;

    node_sizes.resize(num_nodes, 0);

    for (int i = 0; i < local_data->num_msgs; i++)
    {
        node = local_data_nodes[i];
        size = local_data->indptr[i+1] - local_data->indptr[i];
        if (node_sizes[node] == 0)
        {
            global_data->num_msgs++;
        }
        node_sizes[node] += size;
    }
    if (global_data->num_msgs)
        global_data->procs = new int[global_data->num_msgs];
    global_data->indptr = new int[global_data->num_msgs+1];
    node_ctr.resize(global_data->num_msgs, 0);

    global_data->num_msgs = 0;
    global_data->indptr[0] = 0;
    for (int i = 0; i < num_nodes; i++)
    {
        if (node_sizes[i])
        {
            global_data->procs[global_data->num_msgs] = i;
            global_data->size_msgs += node_sizes[i];
            node_sizes[i] = global_data->num_msgs;
            global_data->num_msgs++;
            global_data->indptr[global_data->num_msgs] = global_data->size_msgs;
        }
    }

    if (global_data->size_msgs)
        global_data->indices = new int[global_data->size_msgs];
    for (int i = 0; i < local_data->num_msgs; i++)
    {
        node = local_data_nodes[i];
        node_idx = node_sizes[node];
        start = local_data->indptr[i];
        end = local_data->indptr[i+1];
        for (int j = start; j < end; j++)
        {
            idx = global_data->indptr[node_idx] + node_ctr[node_idx]++;
            global_data->indices[idx] = local_data->indices[j];
        }
    }
}